

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

void __thiscall
JsrtDebuggerObjectsManager::~JsrtDebuggerObjectsManager(JsrtDebuggerObjectsManager *this)

{
  DataToDebuggerObjectsDictionary *pDVar1;
  BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DebuggerObjectsDictionary *pDVar2;
  BaseDictionary<unsigned_int,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  
  pDVar1 = this->dataToDebuggerObjectsDictionary;
  if (pDVar1 != (DataToDebuggerObjectsDictionary *)0x0) {
    if (pDVar1->count != pDVar1->freeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                         ,0x86,"(this->dataToDebuggerObjectsDictionary->Count() == 0)",
                         "Should have cleared all debugger objects by now?");
      if (!bVar4) goto LAB_003abf76;
      *puVar5 = 0;
    }
    pAVar6 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    this_00 = this->dataToDebuggerObjectsDictionary;
    JsUtil::
    BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary(this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar6,this_00,0x38);
    this->dataToDebuggerObjectsDictionary = (DataToDebuggerObjectsDictionary *)0x0;
  }
  pDVar2 = this->handleToDebuggerObjectsDictionary;
  if (pDVar2 != (DebuggerObjectsDictionary *)0x0) {
    if (pDVar2->count != pDVar2->freeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                         ,0x8e,"(this->handleToDebuggerObjectsDictionary->Count() == 0)",
                         "Should have cleared all handle by now?");
      if (!bVar4) {
LAB_003abf76:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pAVar6 = &JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    this_01 = this->handleToDebuggerObjectsDictionary;
    JsUtil::
    BaseDictionary<unsigned_int,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary(this_01);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (pAVar6,this_01,0x38);
    this->handleToDebuggerObjectsDictionary = (DebuggerObjectsDictionary *)0x0;
  }
  return;
}

Assistant:

JsrtDebuggerObjectsManager::~JsrtDebuggerObjectsManager()
{
    if (this->dataToDebuggerObjectsDictionary != nullptr)
    {
        AssertMsg(this->dataToDebuggerObjectsDictionary->Count() == 0, "Should have cleared all debugger objects by now?");

        Adelete(this->GetDebugObjectArena(), this->dataToDebuggerObjectsDictionary);
        this->dataToDebuggerObjectsDictionary = nullptr;
    }

    if (this->handleToDebuggerObjectsDictionary != nullptr)
    {
        AssertMsg(this->handleToDebuggerObjectsDictionary->Count() == 0, "Should have cleared all handle by now?");

        Adelete(this->GetDebugObjectArena(), this->handleToDebuggerObjectsDictionary);
        this->handleToDebuggerObjectsDictionary = nullptr;
    }
}